

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O1

any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
 __thiscall
density_examples::operator+
          (density_examples *this,
          any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
          *i_first,any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
                   *i_second)

{
  char *pcVar1;
  int iVar2;
  runtime_error *this_00;
  void *extraout_RDX;
  type_info *ptVar3;
  type_info *ptVar4;
  any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
  aVar5;
  anon_class_16_2_69c16867 local_48;
  anon_class_16_2_a1f30f79 local_38;
  
  ptVar3 = (type_info *)&void::typeinfo;
  ptVar4 = (type_info *)&void::typeinfo;
  if ((i_first->m_type).m_feature_table != (tuple_type *)0x0) {
    ptVar4 = density::
             runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
             ::type_info(&i_first->m_type);
  }
  if ((i_second->m_type).m_feature_table != (tuple_type *)0x0) {
    ptVar3 = density::
             runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
             ::type_info(&i_second->m_type);
  }
  pcVar1 = *(char **)(ptVar4 + 8);
  if (pcVar1 != *(char **)(ptVar3 + 8)) {
    if (*pcVar1 == '*') goto LAB_00b9c6cd;
    iVar2 = strcmp(pcVar1,*(char **)(ptVar3 + 8));
    if (iVar2 != 0) goto LAB_00b9c6cd;
  }
  ptVar4 = (type_info *)&void::typeinfo;
  if ((i_first->m_type).m_feature_table != (tuple_type *)0x0) {
    ptVar4 = density::
             runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
             ::type_info(&i_first->m_type);
  }
  pcVar1 = *(char **)(ptVar4 + 8);
  if (pcVar1 != _operator>>) {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,_operator>>);
      if (iVar2 == 0) goto LAB_00b9c6cd;
    }
    *(tuple_type **)this = (i_first->m_type).m_feature_table;
    *(undefined8 *)(this + 8) = 0;
    local_48.i_first = i_first;
    local_48.i_second = i_second;
    any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
    ::allocate((any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
                *)this);
    local_38.i_construction_func = &local_48;
    local_38.this =
         (any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_istream,_density::f_ostream,_density_examples::f_sum>
          *)this;
    any<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density::f_istream,density::f_ostream,density_examples::f_sum>
    ::operator+((any<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density::f_istream,density::f_ostream,density_examples::f_sum>
                 *)this,&local_38);
    aVar5.m_object = extraout_RDX;
    aVar5.m_type.m_feature_table = (tuple_type *)this;
    return aVar5;
  }
LAB_00b9c6cd:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Mismatching types");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

any<FEATURES...> operator+(const any<FEATURES...> & i_first, const any<FEATURES...> & i_second)
    {
        using namespace density;
        static_assert( // for simplicity we don't SFINAE
          density::has_features<feature_list<FEATURES...>, f_sum>::value,
          "The provided any leaks the feature sum_impl");

        if (i_first.type() != i_second.type() || i_first.type() == typeid(void))
            throw std::runtime_error("Mismatching types");

        return any<FEATURES...>(i_first.get_runtime_type(), [&](void * i_dest) {
            i_first.template get_type_feature<f_sum>()(
              i_dest, i_first.object_ptr(), i_second.object_ptr());
        });
    }